

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  curl_socket_callback p_Var4;
  byte bVar5;
  bool bVar6;
  Curl_easy *pCVar7;
  uint uVar8;
  curl_hash *pcVar9;
  void *pvVar10;
  ulong uVar11;
  uint uVar12;
  size_t key_len;
  ulong uVar13;
  long lVar14;
  Curl_easy **key;
  size_t __n;
  uint uVar15;
  int iVar16;
  uint uVar17;
  Curl_multi *pCVar18;
  curl_socket_t socks [5];
  int actions [5];
  undefined1 local_8c [4];
  Curl_easy *local_88;
  curl_hash *local_80;
  Curl_multi *local_78;
  int local_6c;
  curl_socket_t local_68 [8];
  uint local_48 [6];
  
  local_68[0] = -1;
  local_68[1] = 0xffffffff;
  local_68[2] = 0xffffffff;
  local_68[3] = 0xffffffff;
  local_68[4] = 0xffffffff;
  local_88 = data;
  local_78 = multi;
  uVar8 = multi_getsock(data,local_68);
  local_80 = &multi->sockhash;
  uVar13 = 0;
  do {
    bVar5 = (byte)uVar13;
    uVar15 = 0x10000 << (bVar5 & 0x1f);
    if ((uVar8 >> (bVar5 & 0x1f) & 0x10001) == 0) goto LAB_00129a1a;
    uVar17 = 1 << (bVar5 & 0x1f);
    iVar2 = local_68[uVar13];
    local_8c = (undefined1  [4])iVar2;
    if (iVar2 == -1) {
      pcVar9 = (curl_hash *)0x0;
    }
    else {
      pcVar9 = (curl_hash *)Curl_hash_pick(local_80,local_8c,4);
    }
    uVar3 = (uint)((uVar17 & uVar8) != 0);
    uVar12 = uVar3 + 2;
    if ((uVar15 & uVar8) == 0) {
      uVar12 = uVar3;
    }
    local_48[uVar13] = uVar12;
    if (pcVar9 == (curl_hash *)0x0) {
      local_8c = (undefined1  [4])iVar2;
      local_6c = iVar2;
      if ((iVar2 == -1) ||
         (pcVar9 = (curl_hash *)Curl_hash_pick(local_80,local_8c,4), pcVar9 == (curl_hash *)0x0)) {
        pcVar9 = (curl_hash *)(*Curl_ccalloc)(1,0x50);
        if (pcVar9 == (curl_hash *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        iVar16 = Curl_hash_init(pcVar9,0xd,trhash,trhash_compare,trhash_dtor);
        if (iVar16 != 0) {
LAB_00129b4d:
          (*Curl_cfree)(pcVar9);
          return CURLM_OUT_OF_MEMORY;
        }
        pvVar10 = Curl_hash_add(local_80,&local_6c,4,pcVar9);
        if (pvVar10 == (void *)0x0) {
          Curl_hash_destroy(pcVar9);
          goto LAB_00129b4d;
        }
      }
    }
    else if (0 < (long)local_88->numsocks) {
      lVar14 = 0;
      do {
        if (iVar2 == local_88->sockets[lVar14]) {
          uVar3 = local_88->actions[lVar14];
          bVar6 = true;
          pCVar18 = local_78;
          if (uVar3 != uVar12) {
            if ((uVar3 & 1) != 0) {
              piVar1 = (int *)((long)&pcVar9[1].comp_func + 4);
              *piVar1 = *piVar1 + -1;
            }
            if ((uVar3 & 2) != 0) {
              *(int *)&pcVar9[1].dtor = *(int *)&pcVar9[1].dtor + -1;
            }
            if ((uVar17 & uVar8) != 0) {
              piVar1 = (int *)((long)&pcVar9[1].comp_func + 4);
              *piVar1 = *piVar1 + 1;
            }
            if ((uVar15 & uVar8) != 0) {
              *(int *)&pcVar9[1].dtor = *(int *)&pcVar9[1].dtor + 1;
            }
          }
          goto LAB_0012997c;
        }
        lVar14 = lVar14 + 1;
      } while (local_88->numsocks != lVar14);
    }
    pCVar18 = local_78;
    *(int *)&pcVar9[1].comp_func = *(int *)&pcVar9[1].comp_func + 1;
    if ((uVar17 & uVar8) != 0) {
      piVar1 = (int *)((long)&pcVar9[1].comp_func + 4);
      *piVar1 = *piVar1 + 1;
    }
    if ((uVar15 & uVar8) != 0) {
      *(int *)&pcVar9[1].dtor = *(int *)&pcVar9[1].dtor + 1;
    }
    pvVar10 = Curl_hash_add(pcVar9,&local_88,8,local_88);
    if (pvVar10 == (void *)0x0) {
      return CURLM_OUT_OF_MEMORY;
    }
    bVar6 = false;
LAB_0012997c:
    iVar16 = (uint)(*(int *)((long)&pcVar9[1].comp_func + 4) != 0) +
             (uint)(*(int *)&pcVar9[1].dtor != 0) * 2;
    if ((!bVar6) || (*(int *)&pcVar9[1].table != iVar16)) {
      if (pCVar18->socket_cb != (curl_socket_callback)0x0) {
        (*pCVar18->socket_cb)(local_88,iVar2,iVar16,pCVar18->socket_userp,pcVar9[1].hash_func);
      }
      *(int *)&pcVar9[1].table = iVar16;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 5);
  uVar13 = 5;
LAB_00129a1a:
  if (0 < local_88->numsocks) {
    lVar14 = 0;
    do {
      pCVar18 = local_78;
      iVar2 = local_88->sockets[lVar14];
      if ((int)uVar13 != 0) {
        uVar11 = 0;
        do {
          if (iVar2 == local_68[uVar11]) goto LAB_00129af6;
          uVar11 = uVar11 + 1;
        } while ((uVar13 & 0xffffffff) != uVar11);
      }
      local_8c = (undefined1  [4])iVar2;
      if ((iVar2 != -1) &&
         (pcVar9 = (curl_hash *)Curl_hash_pick(local_80,local_8c,4), pcVar9 != (curl_hash *)0x0)) {
        uVar8 = local_88->actions[lVar14];
        iVar16 = *(int *)&pcVar9[1].comp_func + -1;
        *(int *)&pcVar9[1].comp_func = iVar16;
        if ((uVar8 & 2) != 0) {
          *(int *)&pcVar9[1].dtor = *(int *)&pcVar9[1].dtor + -1;
        }
        if ((uVar8 & 1) != 0) {
          piVar1 = (int *)((long)&pcVar9[1].comp_func + 4);
          *piVar1 = *piVar1 + -1;
        }
        if (iVar16 == 0) {
          p_Var4 = pCVar18->socket_cb;
          if (p_Var4 != (curl_socket_callback)0x0) {
            (*p_Var4)(local_88,iVar2,4,pCVar18->socket_userp,pcVar9[1].hash_func);
          }
          local_8c = (undefined1  [4])iVar2;
          Curl_hash_destroy(pcVar9);
          key_len = 4;
          key = (Curl_easy **)local_8c;
          pcVar9 = local_80;
        }
        else {
          key_len = 8;
          key = &local_88;
        }
        Curl_hash_delete(pcVar9,key,key_len);
      }
LAB_00129af6:
      lVar14 = lVar14 + 1;
    } while (lVar14 < local_88->numsocks);
  }
  pCVar7 = local_88;
  __n = (uVar13 & 0xffffffff) << 2;
  memcpy(local_88->sockets,local_68,__n);
  memcpy(pCVar7->actions,local_48,__n);
  pCVar7->numsocks = (int)uVar13;
  return CURLM_OK;
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  int actions[MAX_SOCKSPEREASYHANDLE];

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    unsigned int action = CURL_POLL_NONE;
    unsigned int prevaction = 0;
    unsigned int comboaction;
    bool sincebefore = FALSE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    actions[i] = action;
    if(entry) {
      /* check if new for this transfer */
      int j;
      for(j = 0; j< data->numsocks; j++) {
        if(s == data->sockets[j]) {
          prevaction = data->actions[j];
          sincebefore = TRUE;
          break;
        }
      }
    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(sincebefore && (prevaction != action)) {
      /* Socket was used already, but different action now */
      if(prevaction & CURL_POLL_IN)
        entry->readers--;
      if(prevaction & CURL_POLL_OUT)
        entry->writers--;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!sincebefore) {
      /* a new user */
      entry->users++;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data))
        return CURLM_OUT_OF_MEMORY;
    }

    comboaction = (entry->writers? CURL_POLL_OUT : 0) |
      (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(sincebefore && (entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb)
      multi->socket_cb(data, s, comboaction, multi->socket_userp,
                       entry->socketp);

    entry->action = comboaction; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    bool stillused = FALSE;
    s = data->sockets[i];
    for(j = 0; j < num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      int oldactions = data->actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb)
          multi->socket_cb(data, s, CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(entry, &multi->sockhash, s);
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  memcpy(data->actions, actions, num*sizeof(int));
  data->numsocks = num;
  return CURLM_OK;
}